

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O1

GLHorizonInfo * __thiscall
UniqueList<GLHorizonInfo>::Get(UniqueList<GLHorizonInfo> *this,GLHorizonInfo *t)

{
  uint uVar1;
  GLHorizonInfo **ppGVar2;
  double dVar3;
  float fVar4;
  PalEntry PVar5;
  PalEntry PVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  GLHorizonInfo *unaff_R14;
  bool bVar11;
  
  uVar10 = (ulong)(this->Array).Count;
  bVar11 = uVar10 != 0;
  if (bVar11) {
    ppGVar2 = (this->Array).Array;
    unaff_R14 = *ppGVar2;
    iVar8 = bcmp(t,unaff_R14,0x60);
    if (iVar8 != 0) {
      uVar7 = 1;
      do {
        uVar9 = uVar7;
        if (uVar10 == uVar9) break;
        unaff_R14 = ppGVar2[uVar9];
        iVar8 = bcmp(t,unaff_R14,0x60);
        uVar7 = uVar9 + 1;
      } while (iVar8 != 0);
      bVar11 = uVar9 < uVar10;
    }
  }
  if (!bVar11) {
    unaff_R14 = (GLHorizonInfo *)operator_new(0x60);
    (unaff_R14->plane).texture.texnum = (t->plane).texture.texnum;
    (unaff_R14->plane).plane.normal.Z = (t->plane).plane.normal.Z;
    (unaff_R14->plane).plane.normal.Y = (t->plane).plane.normal.Y;
    (unaff_R14->plane).plane.normal.X = (t->plane).plane.normal.X;
    dVar3 = (t->plane).plane.negiC;
    (unaff_R14->plane).plane.D = (t->plane).plane.D;
    (unaff_R14->plane).plane.negiC = dVar3;
    fVar4 = (t->plane).Angle;
    (unaff_R14->plane).Texheight = (t->plane).Texheight;
    (unaff_R14->plane).Angle = fVar4;
    (unaff_R14->plane).Offs.Y = (t->plane).Offs.Y;
    (unaff_R14->plane).Offs.X = (t->plane).Offs.X;
    (unaff_R14->plane).Scale.Y = (t->plane).Scale.Y;
    (unaff_R14->plane).Scale.X = (t->plane).Scale.X;
    (unaff_R14->colormap).blendfactor = (t->colormap).blendfactor;
    PVar5.field_0 = (t->colormap).LightColor.field_0;
    PVar6.field_0 = (t->colormap).FadeColor.field_0;
    iVar8 = (t->colormap).desaturation;
    unaff_R14->lightlevel = t->lightlevel;
    (unaff_R14->colormap).LightColor = (PalEntry)PVar5.field_0;
    (unaff_R14->colormap).FadeColor = (PalEntry)PVar6.field_0;
    (unaff_R14->colormap).desaturation = iVar8;
    TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Grow(&this->Array,1);
    uVar1 = (this->Array).Count;
    (this->Array).Array[uVar1] = unaff_R14;
    (this->Array).Count = uVar1 + 1;
  }
  return unaff_R14;
}

Assistant:

T * Get(T * t)
	{
		for(unsigned i=0;i<Array.Size();i++)
		{
			if (!memcmp(t, Array[i], sizeof(T))) return Array[i];
		}
		T * newo=TheFreeList.GetNew();

		*newo=*t;
		Array.Push(newo);
		return newo;
	}